

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O0

void __thiscall Connection_testSpike_Test::TestBody(Connection_testSpike_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_118;
  Message local_110;
  float local_104;
  Connection local_100;
  float local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_1;
  Connection s;
  Message local_b0 [3];
  float local_98;
  float local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Neuron n;
  Connection_testSpike_Test *this_local;
  
  Neuron::Neuron((Neuron *)&gtest_ar.message_,10.0,1.0,50.0);
  local_94 = 0.0;
  local_98 = Neuron::syn((Neuron *)&gtest_ar.message_);
  testing::internal::EqHelper<true>::Compare<int,float>
            (local_90,"0",(int *)"n.syn()",&local_94,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s.m_expire,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x29,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s.m_expire,local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s.m_expire);
    testing::Message::~Message(local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  Connection::Connection
            ((Connection *)&gtest_ar_1.message_,(Neuron *)&gtest_ar.message_,10.0,100.0,100.0);
  Connection::spike((Connection *)&gtest_ar_1.message_);
  Connection::Connection(&local_100,(Neuron *)0x0,10.0,100.0,100.0);
  local_e4 = Connection::weight(&local_100);
  local_104 = Neuron::syn((Neuron *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<float,float>
            ((EqHelper<false> *)local_e0,"Connection(0, 10).weight()","n.syn()",&local_e4,&local_104
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  Neuron::~Neuron((Neuron *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Connection, testSpike)
{
    Neuron n;
    EXPECT_EQ(0, n.syn());
    Connection s(&n, 10);
    s.spike();
    EXPECT_EQ(Connection(0, 10).weight(), n.syn());
}